

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManCreateRefs(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  if (p->pRefs != (int *)0x0) {
    __assert_fail("p->pRefs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x2cf,"void Gia_ManCreateRefs(Gia_Man_t *)");
  }
  iVar1 = Gia_ManObjNum(p);
  piVar2 = (int *)calloc((long)iVar1,4);
  p->pRefs = piVar2;
  local_1c = 0;
  while( true ) {
    bVar3 = false;
    if (local_1c < p->nObjs) {
      pGStack_18 = Gia_ManObj(p,local_1c);
      bVar3 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd(pGStack_18);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pGStack_18);
      if (iVar1 != 0) {
        Gia_ObjRefFanin0Inc(p,pGStack_18);
      }
    }
    else {
      Gia_ObjRefFanin0Inc(p,pGStack_18);
      Gia_ObjRefFanin1Inc(p,pGStack_18);
      iVar1 = Gia_ObjIsMuxId(p,local_1c);
      if (iVar1 != 0) {
        Gia_ObjRefFanin2Inc(p,pGStack_18);
      }
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Gia_ManCreateRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pRefs == NULL );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjRefFanin0Inc( p, pObj );
            Gia_ObjRefFanin1Inc( p, pObj );
            if ( Gia_ObjIsMuxId(p, i) )
                Gia_ObjRefFanin2Inc( p, pObj );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjRefFanin0Inc( p, pObj );
    }
}